

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Unicode.cc
# Opt level: O3

void onmt::unicode::explode_utf8
               (string *str,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *chars,vector<int,_std::allocator<int>_> *code_points)

{
  char *pcVar1;
  iterator __position;
  code_point_t cVar2;
  char *c_str;
  char *str_00;
  size_t char_size;
  size_t local_50;
  code_point_t local_44;
  size_t local_40;
  char *local_38;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::reserve(chars,str->_M_string_length);
  std::vector<int,_std::allocator<int>_>::reserve(code_points,str->_M_string_length);
  str_00 = (str->_M_dataplus)._M_p;
  if (*str_00 != '\0') {
    do {
      local_50 = 0;
      cVar2 = utf8_to_cp(str_00,&local_50);
      if (cVar2 == 0) {
        local_50 = 1;
      }
      else {
        local_40 = local_50;
        __position._M_current =
             (code_points->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        local_44 = cVar2;
        local_38 = str_00;
        if (__position._M_current ==
            (code_points->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)code_points,__position,&local_44);
        }
        else {
          *__position._M_current = cVar2;
          (code_points->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
          super__Vector_impl_data._M_finish = __position._M_current + 1;
        }
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const*&,unsigned_long&>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)chars,
                   &local_38,&local_40);
      }
      pcVar1 = str_00 + local_50;
      str_00 = str_00 + local_50;
    } while (*pcVar1 != '\0');
  }
  return;
}

Assistant:

void explode_utf8(const std::string& str,
                      std::vector<std::string>& chars,
                      std::vector<code_point_t>& code_points)
    {
      chars.reserve(str.length());
      code_points.reserve(str.length());

      const auto callback = [&chars, &code_points](const char* data,
                                                   size_t length,
                                                   code_point_t code_point) {
        code_points.push_back(code_point);
        chars.emplace_back(data, length);
      };

      character_iterator(str, callback);
    }